

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O3

SyntaxKind slang::syntax::SyntaxFacts::getLiteralExpression(TokenKind kind)

{
  undefined2 in_register_0000003a;
  
  switch(CONCAT22(in_register_0000003a,kind)) {
  case 4:
    return StringLiteralExpression;
  case 5:
    return IntegerLiteralExpression;
  case 6:
    goto switchD_0020b12e_caseD_6;
  case 7:
    return UnbasedUnsizedLiteralExpression;
  case 8:
    return RealLiteralExpression;
  case 9:
    return TimeLiteralExpression;
  default:
    if (CONCAT22(in_register_0000003a,kind) == 0x2c) {
      return WildcardLiteralExpression;
    }
    if (CONCAT22(in_register_0000003a,kind) == 0xe5) {
      return NullLiteralExpression;
    }
switchD_0020b12e_caseD_6:
    return Unknown;
  }
}

Assistant:

SyntaxKind SyntaxFacts::getLiteralExpression(TokenKind kind) {
    switch (kind) {
        case TokenKind::StringLiteral: return SyntaxKind::StringLiteralExpression;
        case TokenKind::IntegerLiteral: return SyntaxKind::IntegerLiteralExpression;
        case TokenKind::UnbasedUnsizedLiteral: return SyntaxKind::UnbasedUnsizedLiteralExpression;
        case TokenKind::RealLiteral: return SyntaxKind::RealLiteralExpression;
        case TokenKind::TimeLiteral: return SyntaxKind::TimeLiteralExpression;
        case TokenKind::NullKeyword: return SyntaxKind::NullLiteralExpression;
        case TokenKind::Dollar: return SyntaxKind::WildcardLiteralExpression;
        default: return SyntaxKind::Unknown;
    }
}